

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void kj::Arena::destroyObject<kj::_::Deferred<capnp::compiler::Compiler::Alias::compile()::__0>>
               (void *pointer)

{
  long lVar1;
  
  if (*pointer == '\x01') {
    lVar1 = *(long *)((long)pointer + 8);
    *(undefined1 *)pointer = 0;
    *(undefined1 *)(lVar1 + 0xd0) = 0;
    if (*(long *)(lVar1 + 0xb8) != 0) {
      capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(lVar1 + 0xb0));
    }
    *(undefined8 *)(lVar1 + 0xc0) = 0;
    *(undefined8 *)(lVar1 + 200) = 0;
    (((OrphanBuilder *)(lVar1 + 0xb0))->tag).content = 0;
    *(undefined8 *)(lVar1 + 0xb8) = 0;
  }
  return;
}

Assistant:

inline NullableValue(NullableValue&& other)
      : isSet(other.isSet) {
    if (isSet) {
      ctor(value, kj::mv(other.value));
    }
  }